

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  undefined3 in_register_00000089;
  StringBaseTextGenerator generator;
  
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__StringBaseTextGenerator_0079eec0;
  paVar1 = &generator.output_.field_2;
  generator.output_._M_string_length = 0;
  generator.output_.field_2._M_local_buf[0] = '\0';
  pcVar2 = "}\n";
  if (CONCAT31(in_register_00000089,single_line_mode) != 0) {
    pcVar2 = "} ";
  }
  generator.output_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::append((char *)&generator.output_,(ulong)pcVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)generator.output_._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(generator.output_.field_2._M_allocated_capacity._1_7_,
                  generator.output_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = generator.output_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = generator.output_._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(generator.output_.field_2._M_allocated_capacity._1_7_,
                  generator.output_.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = generator.output_._M_string_length;
  generator.output_._M_string_length = 0;
  generator.output_.field_2._M_local_buf[0] = '\0';
  generator.output_._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator(&generator);
  return __return_storage_ptr__;
}

Assistant:

void Print(const char* text, size_t size) override {
    output_.append(text, size);
  }